

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mergesort.cpp
# Opt level: O2

void mergesort_4way_register_hook(void)

{
  routine_register(&mergesort_4way_routine);
  return;
}

Assistant:

void
mergesort_4way_parallel(unsigned char** strings, size_t n, unsigned char** tmp)
{
	debug() << __func__ << "(), n="<<n<<"\n";
	if (n < 32) {
		insertion_sort(strings, n, 0);
		return;
	}
	const size_t split0 = n/4,
	             split1 = n/2,
	             split2 = split0+split1;
#pragma omp parallel sections
	{
#pragma omp section
		mergesort_4way_parallel(strings,        split0,        tmp);
#pragma omp section
		mergesort_4way_parallel(strings+split0, split1-split0, tmp+split0);
#pragma omp section
		mergesort_4way_parallel(strings+split1, split2-split1, tmp+split1);
#pragma omp section
		mergesort_4way_parallel(strings+split2, n-split2,      tmp+split2);
	}
	merge_4way(strings,        split0,
	           strings+split0, split1-split0,
	           strings+split1, split2-split1,
	           strings+split2, n-split2,
	           tmp);
	(void) memcpy(strings, tmp, n*sizeof(unsigned char*));
}